

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_get_keycode
          (exr_const_context_t_conflict ctxt,int part_index,char *name,exr_attr_keycode_t *out)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  exr_result_t eVar6;
  exr_attribute_t *in_RAX;
  exr_context_t nonc;
  exr_attribute_t *attr;
  exr_attribute_t *local_28;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  local_28 = in_RAX;
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar6 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar6;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar6 = (*ctxt->report_error)(ctxt,3,"Invalid name for keycode attribute query");
    return eVar6;
  }
  eVar6 = exr_attr_list_find_by_name(ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_28)
  ;
  if (eVar6 == 0) {
    if (local_28->type != EXR_ATTR_KEYCODE) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar6 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'keycode\', but stored attributes is type \'%s\'",
                         name,local_28->type_name);
      return eVar6;
    }
    if (out == (exr_attr_keycode_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar6 = (*ctxt->print_error)(ctxt,3,"NULL output for \'%s\'",name);
      return eVar6;
    }
    peVar1 = (local_28->field_6).m33d;
    dVar2 = peVar1->m[0];
    dVar3 = peVar1->m[1];
    uVar4 = *(undefined8 *)((long)peVar1->m + 0xc);
    uVar5 = *(undefined8 *)((long)peVar1->m + 0x14);
    out->count = (int)uVar4;
    out->perf_offset = (int)((ulong)uVar4 >> 0x20);
    out->perfs_per_frame = (int)uVar5;
    out->perfs_per_count = (int)((ulong)uVar5 >> 0x20);
    *(double *)out = dVar2;
    *(double *)&out->prefix = dVar3;
    eVar6 = 0;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  return eVar6;
}

Assistant:

exr_result_t
exr_attr_get_keycode (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_keycode_t* out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_KEYCODE, keycode);
}